

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

void __thiscall osqp::OsqpSettings::OsqpSettings(OsqpSettings *this)

{
  undefined1 local_c0 [8];
  OSQPSettings osqp_settings;
  OsqpSettings *this_local;
  
  osqp_settings.time_limit = (c_float)this;
  osqp_set_default_settings((OSQPSettings *)local_c0);
  anon_unknown_6::CopyFromInternalSettings((OSQPSettings *)local_c0,this);
  return;
}

Assistant:

OsqpSettings::OsqpSettings() {
  ::OSQPSettings osqp_settings;
  osqp_set_default_settings(&osqp_settings);
  CopyFromInternalSettings(osqp_settings, this);
}